

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationrootelements.cpp
# Opt level: O2

uint32_t __thiscall
icu_63::CollationRootElements::getPrimaryBefore
          (CollationRootElements *this,uint32_t p,UBool isCompressible)

{
  uint32_t *puVar1;
  int32_t iVar2;
  uint32_t uVar3;
  long lVar4;
  uint *puVar5;
  uint step;
  
  iVar2 = findP(this,p);
  puVar1 = this->elements;
  lVar4 = (long)iVar2;
  if ((puVar1[lVar4] & 0xffffff00) == p) {
    step = puVar1[lVar4] & 0x7f;
    if (step == 0) {
      puVar5 = puVar1 + lVar4;
      do {
        puVar5 = puVar5 + -1;
      } while ((char)*puVar5 < '\0');
      return *puVar5 & 0xffffff00;
    }
  }
  else {
    step = puVar1[lVar4 + 1] & 0x7f;
  }
  if ((short)p != 0) {
    uVar3 = Collation::decThreeBytePrimaryByOneStep(p,isCompressible,step);
    return uVar3;
  }
  uVar3 = Collation::decTwoBytePrimaryByOneStep(p,isCompressible,step);
  return uVar3;
}

Assistant:

uint32_t
CollationRootElements::getPrimaryBefore(uint32_t p, UBool isCompressible) const {
    int32_t index = findPrimary(p);
    int32_t step;
    uint32_t q = elements[index];
    if(p == (q & 0xffffff00)) {
        // Found p itself. Return the previous primary.
        // See if p is at the end of a previous range.
        step = (int32_t)q & PRIMARY_STEP_MASK;
        if(step == 0) {
            // p is not at the end of a range. Look for the previous primary.
            do {
                p = elements[--index];
            } while((p & SEC_TER_DELTA_FLAG) != 0);
            return p & 0xffffff00;
        }
    } else {
        // p is in a range, and not at the start.
        uint32_t nextElement = elements[index + 1];
        U_ASSERT(isEndOfPrimaryRange(nextElement));
        step = (int32_t)nextElement & PRIMARY_STEP_MASK;
    }
    // Return the previous range primary.
    if((p & 0xffff) == 0) {
        return Collation::decTwoBytePrimaryByOneStep(p, isCompressible, step);
    } else {
        return Collation::decThreeBytePrimaryByOneStep(p, isCompressible, step);
    }
}